

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qppmhandler.cpp
# Opt level: O3

ssize_t __thiscall QPpmHandler::read(QPpmHandler *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  uint uVar2;
  QSize size;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  QIODevice *d;
  ulong uVar12;
  uchar *puVar13;
  uint *puVar14;
  qsizetype i;
  long lVar15;
  uint *puVar16;
  uint *puVar17;
  byte bVar18;
  ushort uVar19;
  Format format;
  undefined4 in_register_00000034;
  QImage *image;
  ushort uVar20;
  ulong uVar21;
  long lVar22;
  ushort *puVar23;
  State SVar24;
  long lVar25;
  long lVar26;
  uint *puVar27;
  int iVar28;
  int i_1;
  int iVar29;
  undefined1 *puVar30;
  long in_FS_OFFSET;
  byte local_b0;
  ushort *local_a8;
  uint local_78;
  bool local_39;
  long local_38;
  
  image = (QImage *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->state == Error) {
    uVar21 = 0;
    goto LAB_002b6ebb;
  }
  if ((this->state == Ready) && (bVar4 = readHeader(this), !bVar4)) goto LAB_002b6eb5;
  d = QImageIOHandler::device(&this->super_QImageIOHandler);
  bVar18 = this->type;
  uVar12 = (ulong)bVar18;
  uVar21 = 0;
  SVar24 = Error;
  if (0x36 < uVar12) goto LAB_002b6eb7;
  iVar28 = this->width;
  iVar1 = this->height;
  size.wd.m_i = this->width;
  size.ht.m_i = this->height;
  uVar2 = this->mcc;
  if ((0x12000000000000U >> (uVar12 & 0x3f) & 1) == 0) {
    if ((0x24000000000000U >> (uVar12 & 0x3f) & 1) != 0) {
      lVar25 = 8;
      bVar4 = true;
      format = Format_Grayscale8;
      local_b0 = 0;
      goto LAB_002b66b5;
    }
    if ((0x48000000000000U >> (uVar12 & 0x3f) & 1) == 0) goto LAB_002b6eb7;
    lVar25 = 0x20;
    bVar3 = true;
    format = Format_RGB32;
    local_b0 = 0;
    bVar4 = false;
  }
  else {
    bVar4 = false;
    lVar25 = 1;
    local_b0 = 1;
    format = Format_Mono;
LAB_002b66b5:
    bVar3 = false;
  }
  bVar5 = QImageIOHandler::allocateImage(size,format,image);
  if (!bVar5) goto LAB_002b6eb5;
  lVar15 = (long)iVar28;
  lVar25 = lVar25 * lVar15;
  lVar22 = lVar25 + 7;
  lVar26 = lVar25 + 0xe;
  if (-1 < lVar22) {
    lVar26 = lVar22;
  }
  puVar16 = (uint *)(lVar26 >> 3);
  puVar17 = (uint *)(ulong)uVar2;
  if (bVar18 < 0x34) {
    local_39 = true;
    if (iVar1 < 1) goto joined_r0x002b6e64;
    lVar26 = lVar25 + 0x26;
    if (-1 < lVar22) {
      lVar26 = lVar22;
    }
    local_78 = uVar2 & 0xffff;
    lVar22 = (lVar26 >> 5) + -1;
    iVar8 = 0;
    bVar18 = 1;
    do {
      puVar13 = QImage::scanLine(image,iVar8);
      if (local_b0 == 0) {
        if (bVar4) {
          bVar6 = lVar25 - 1U < 0xfffffffffffffff1 & bVar18;
          if (uVar2 == 0xff) {
            if (bVar6 != 0) {
              puVar30 = (undefined1 *)0x0;
              do {
                iVar10 = read_pbm_int(d,&local_39,-1);
                puVar13[(long)puVar30] = (uchar)iVar10;
                bVar18 = local_39;
                if ((undefined1 *)((long)puVar16 + -1) == puVar30) break;
                puVar30 = puVar30 + 1;
              } while ((local_39 & 1U) != 0);
            }
          }
          else if (bVar6 != 0) {
            puVar30 = (undefined1 *)0x0;
            do {
              uVar7 = read_pbm_int(d,&local_39,-1);
              puVar17 = (uint *)(ulong)(uVar7 & 0xffff);
              puVar13[(long)puVar30] = (uchar)((int)((uVar7 & 0xffff) * 0xff) / (int)uVar2);
              bVar18 = local_39;
              if ((undefined1 *)((long)puVar16 + -1) == puVar30) break;
              puVar30 = puVar30 + 1;
            } while ((local_39 & 1U) != 0);
          }
        }
        else {
          bVar6 = lVar25 - 0x19U < 0xffffffffffffffc1 & bVar18;
          if (uVar2 == 0xff) {
            if (bVar6 != 0) {
              lVar26 = 0;
              do {
                iVar10 = read_pbm_int(d,&local_39,-1);
                uVar7 = read_pbm_int(d,&local_39,-1);
                uVar9 = read_pbm_int(d,&local_39,-1);
                uVar7 = (uVar7 & 0xff) << 8 | iVar10 << 0x10;
                puVar17 = (uint *)(ulong)uVar7;
                *(uint *)(puVar13 + lVar26 * 4) = uVar9 & 0xff | uVar7 | 0xff000000;
                bVar18 = local_39;
                if (lVar22 == lVar26) break;
                lVar26 = lVar26 + 1;
              } while ((local_39 & 1U) != 0);
            }
          }
          else if (bVar6 != 0) {
            lVar26 = 0;
            do {
              uVar7 = read_pbm_int(d,&local_39,-1);
              uVar9 = read_pbm_int(d,&local_39,-1);
              uVar11 = read_pbm_int(d,&local_39,-1);
              uVar21 = (ulong)((uVar7 * 0x10000 - (uVar7 & 0xffff)) / local_78 & 0xffff) +
                       0x8000000080 +
                       ((ulong)((uVar11 * 0x10000 - (uVar11 & 0xffff)) / local_78 & 0xffff) << 0x20)
              ;
              uVar7 = ((uVar9 * 0x10000 - (uVar9 & 0xffff)) / local_78 & 0xffff) + 0x80;
              uVar21 = uVar21 - (uVar21 >> 8 & 0x1ff000001ff);
              puVar17 = (uint *)(uVar21 >> 0x28);
              *(uint *)(puVar13 + lVar26 * 4) =
                   ((uint)(uVar21 >> 0x28) & 0xff) +
                   (uVar7 - (uVar7 >> 8) & 0xff00 | ((uint)uVar21 & 0xff00) << 8) + -0x1000000;
              bVar18 = local_39;
              if (lVar22 == lVar26) break;
              lVar26 = lVar26 + 1;
            } while ((local_39 & 1U) != 0);
          }
        }
      }
      else {
        iVar10 = iVar28;
        puVar27 = puVar16;
        if (lVar25 - 1U < 0xfffffffffffffff1) {
          while ((bVar18 & 1) != 0) {
            iVar29 = 0;
            uVar7 = 0;
            do {
              uVar7 = uVar7 * 2;
              if (iVar29 < iVar10) {
                uVar9 = read_pbm_int(d,&local_39,1);
                uVar7 = uVar7 | uVar9 & 1;
              }
              iVar29 = iVar29 + 1;
            } while (iVar29 != 8);
            *puVar13 = (uchar)uVar7;
            bVar18 = local_39;
            if ((uint *)((long)puVar27 + -1) == (uint *)0x0) break;
            puVar13 = puVar13 + 1;
            iVar10 = iVar10 + -8;
            puVar27 = (uint *)((long)puVar27 + -1);
          }
        }
      }
      iVar8 = iVar8 + 1;
    } while ((iVar8 < iVar1) && ((bVar18 & 1) != 0));
    if ((local_b0 & bVar18) != 0) goto LAB_002b6e66;
    if ((bVar18 & 1) == 0) {
LAB_002b6d0e:
      uVar21 = 0;
      SVar24 = Error;
      goto LAB_002b6eb7;
    }
  }
  else {
    if (bVar3) {
      uVar21 = (ulong)(int)(((uint)(0xff < (int)uVar2) * 3 + 3) * iVar28);
      local_a8 = (ushort *)operator_new__(uVar21);
      if (0 < iVar1) {
        iVar8 = 0;
        do {
          uVar12 = QIODevice::read((char *)d,(longlong)local_a8);
          if (uVar12 != uVar21) goto LAB_002b6eab;
          puVar16 = (uint *)QImage::scanLine(image,iVar8);
          if (0 < iVar28) {
            puVar17 = puVar16;
            puVar23 = local_a8;
            do {
              bVar18 = (byte)*puVar23;
              if ((int)uVar2 < 0x100) {
                if (uVar2 == 0xff) {
                  uVar7 = (uint)*(byte *)((long)puVar23 + 1) << 8 | (uint)bVar18 << 0x10 |
                          (uint)(byte)puVar23[1];
                }
                else {
                  uVar12 = (ulong)(((uint)bVar18 * 0xffff) / (uVar2 & 0xffff) & 0xffff) +
                           0x8000000080 +
                           ((ulong)(((uint)(byte)puVar23[1] * 0x10000 - (uint)(byte)puVar23[1]) /
                                    (uVar2 & 0xffff) & 0xffff) << 0x20);
                  uVar7 = (((uint)*(byte *)((long)puVar23 + 1) * 0x10000 -
                           (uint)*(byte *)((long)puVar23 + 1)) / (uVar2 & 0xffff) & 0xffff) + 0x80;
                  lVar25 = uVar12 - (uVar12 >> 8 & 0x1ff000001ff);
                  uVar7 = (uint)((ulong)lVar25 >> 0x28) & 0xff |
                          uVar7 - (uVar7 >> 8) & 0xff00 | ((uint)lVar25 & 0xff00) << 8;
                }
                lVar25 = 3;
              }
              else {
                uVar19 = puVar23[1] << 8 | puVar23[1] >> 8;
                uVar20 = puVar23[2] << 8 | puVar23[2] >> 8;
                if (uVar2 == 0xffff) {
                  uVar12 = ((ulong)uVar20 << 0x20 |
                           (ulong)CONCAT11(bVar18,*(byte *)((long)puVar23 + 1))) + 0x8000000080;
                  iVar10 = (int)((ulong)uVar19 + 0x1007f00000080);
                  lVar22 = uVar12 - (uVar12 >> 8 & 0x1ff000001ff);
                  uVar7 = (uint)((ulong)uVar19 + 0x1007f00000080 >> 8);
                }
                else {
                  uVar12 = (ulong)(((uint)CONCAT11(bVar18,*(byte *)((long)puVar23 + 1)) * 0xffff) /
                                   (uVar2 & 0xffff) & 0xffff) + 0x8000000080 +
                           ((ulong)(((uint)uVar20 * 0xffff) / (uVar2 & 0xffff) & 0xffff) << 0x20);
                  lVar25 = (ulong)(((uint)uVar19 * 0x10000 - (uint)uVar19) / (uVar2 & 0xffff) &
                                  0xffff) + 0x1007f00000080;
                  iVar10 = (int)lVar25;
                  lVar22 = uVar12 - (uVar12 >> 8 & 0x1ff000001ff);
                  uVar7 = (uint)((ulong)lVar25 >> 8) & 0x1ff;
                }
                uVar7 = (uint)((ulong)lVar22 >> 0x28) & 0xff |
                        iVar10 - uVar7 & 0xff00 | ((uint)lVar22 & 0xff00) << 8;
                lVar25 = 6;
              }
              *puVar17 = uVar7 | 0xff000000;
              puVar23 = (ushort *)((long)puVar23 + lVar25);
              puVar17 = puVar17 + 1;
            } while (puVar17 < puVar16 + lVar15);
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 != iVar1);
      }
      operator_delete__(local_a8);
    }
    else if ((bool)(0xff < (int)uVar2 & bVar4)) {
      local_a8 = (ushort *)operator_new__(lVar15 * 2);
      if (0 < iVar1) {
        iVar8 = 0;
        do {
          uVar21 = QIODevice::read((char *)d,(longlong)local_a8);
          if (uVar21 != lVar15 * 2) goto LAB_002b6eab;
          puVar16 = (uint *)QImage::scanLine(image,iVar8);
          if (0 < iVar28) {
            puVar17 = puVar16;
            puVar23 = local_a8;
            do {
              uVar19 = *puVar23 << 8 | *puVar23 >> 8;
              *(char *)puVar17 = (char)(((uint)uVar19 * 0x100 - (uint)uVar19) / uVar2);
              puVar17 = (uint *)((long)puVar17 + 1);
              puVar23 = puVar23 + 1;
            } while (puVar17 < (uint *)((long)puVar16 + lVar15));
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 != iVar1);
      }
      operator_delete__(local_a8);
    }
    else if (0 < iVar1) {
      puVar27 = (uint *)0x1;
      if (1 < (long)puVar16) {
        puVar27 = puVar16;
      }
      iVar28 = 0;
      puVar17 = puVar16;
      do {
        puVar13 = QImage::scanLine(image,iVar28);
        puVar14 = (uint *)QIODevice::read((char *)d,(longlong)puVar13);
        if (puVar14 != puVar16) goto LAB_002b6d0e;
        if ((bool)(0 < lVar25 & (int)uVar2 < 0xff & bVar4)) {
          puVar17 = (uint *)0x0;
          do {
            puVar13[(long)puVar17] =
                 (uchar)((int)((uint)puVar13[(long)puVar17] * 0x100 - (uint)puVar13[(long)puVar17])
                        / (int)uVar2);
            puVar17 = (uint *)((long)puVar17 + 1);
          } while (puVar27 != puVar17);
        }
        iVar28 = iVar28 + 1;
      } while (iVar28 != iVar1);
    }
joined_r0x002b6e64:
    if (local_b0 != 0) {
LAB_002b6e66:
      QImage::setColorCount(image,2);
      QImage::setColor(image,0,0xffffffff);
      QImage::setColor(image,1,0xff000000);
    }
  }
  uVar21 = CONCAT71((int7)((ulong)puVar17 >> 8),1);
  SVar24 = Ready;
  goto LAB_002b6eb7;
LAB_002b6eab:
  operator_delete__(local_a8);
LAB_002b6eb5:
  SVar24 = Error;
  uVar21 = 0;
LAB_002b6eb7:
  this->state = SVar24;
LAB_002b6ebb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar21 & 0xffffffff;
}

Assistant:

bool QPpmHandler::read(QImage *image)
{
    if (state == Error)
        return false;

    if (state == Ready && !readHeader()) {
        state = Error;
        return false;
    }

    if (!read_pbm_body(device(), type, width, height, mcc, image)) {
        state = Error;
        return false;
    }

    state = Ready;
    return true;
}